

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ResultBuilder::captureExpression(ResultBuilder *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  IResultCapture *pIVar4;
  IContext *pIVar5;
  IConfig *pIVar6;
  undefined4 extraout_var;
  ResultBuilder *in_RDI;
  AssertionResult result;
  undefined7 in_stack_fffffffffffffee0;
  byte in_stack_fffffffffffffee7;
  Ptr<const_Catch::IConfig> local_d8 [3];
  undefined1 local_c0 [184];
  
  build(in_RDI);
  pIVar4 = getResultCapture();
  (*pIVar4->_vptr_IResultCapture[2])(pIVar4,local_c0);
  bVar1 = AssertionResult::isOk
                    ((AssertionResult *)
                     CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  if (!bVar1) {
    pIVar5 = getCurrentContext();
    (*pIVar5->_vptr_IContext[6])(local_d8);
    pIVar6 = Ptr<const_Catch::IConfig>::operator->(local_d8);
    uVar2 = (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[8])();
    Ptr<const_Catch::IConfig>::~Ptr
              ((Ptr<const_Catch::IConfig> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    if ((uVar2 & 1) != 0) {
      in_RDI->m_shouldDebugBreak = true;
    }
    pIVar5 = getCurrentContext();
    iVar3 = (*pIVar5->_vptr_IContext[3])();
    in_stack_fffffffffffffee7 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))();
    if (((in_stack_fffffffffffffee7 & 1) != 0) ||
       ((in_RDI->m_assertionInfo).resultDisposition == Normal)) {
      in_RDI->m_shouldThrow = true;
    }
  }
  AssertionResult::~AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  return;
}

Assistant:

void ResultBuilder::captureExpression() {
        AssertionResult result = build();
        getResultCapture().assertionEnded( result );

        if( !result.isOk() ) {
            if( getCurrentContext().getConfig()->shouldDebugBreak() )
                m_shouldDebugBreak = true;
            if( getCurrentContext().getRunner()->aborting() || m_assertionInfo.resultDisposition == ResultDisposition::Normal )
                m_shouldThrow = true;
        }
    }